

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmGen10TextureCalc::GetMipTailGeometryOffset
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  uint32_t uVar1;
  uint uVar2;
  SKU_FEATURE_TABLE *pSVar3;
  int iVar4;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  uint local_3c;
  uint32_t Slot;
  uint32_t ArrayIndex;
  uint32_t *OffsetZ_local;
  uint32_t *OffsetY_local;
  uint32_t *OffsetX_local;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen10TextureCalc *this_local;
  
  local_3c = 0;
  pSVar3 = Context::GetSkuTable
                     ((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext);
  if ((((ulong)pSVar3->field_1 >> 0xf & 1) == 0) || (pTexInfo->Type == RESOURCE_3D)) {
    GmmGen9TextureCalc::GetMipTailGeometryOffset
              (&this->super_GmmGen9TextureCalc,pTexInfo,MipLevel,OffsetX,OffsetY,OffsetZ);
  }
  else {
    uVar1 = pTexInfo->BitsPerPixel;
    if (uVar1 == 8) {
      local_3c = 4;
    }
    else if (uVar1 == 0x10) {
      local_3c = 3;
    }
    else if (uVar1 == 0x20) {
      local_3c = 2;
    }
    else if (uVar1 == 0x40) {
      local_3c = 1;
    }
    else if (uVar1 == 0x80) {
      local_3c = 0;
    }
    if (pTexInfo->Type == RESOURCE_1D) {
      iVar4 = 0;
      if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
        iVar4 = 4;
      }
      uVar2 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + iVar4;
      *OffsetX = Gen10MipTailSlotOffset1DSurface[uVar2][local_3c].X * pTexInfo->BitsPerPixel >> 3;
      *OffsetY = Gen10MipTailSlotOffset1DSurface[uVar2][local_3c].Y;
      *OffsetZ = Gen10MipTailSlotOffset1DSurface[uVar2][local_3c].Z;
    }
    else if ((pTexInfo->Type == RESOURCE_2D) || (pTexInfo->Type == RESOURCE_CUBE)) {
      if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
         ((pTexInfo->MSAA).NumSamples != 0x10)) {
        if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 8)
           ) {
          if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
             ((pTexInfo->MSAA).NumSamples != 4)) {
            if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
               ((pTexInfo->MSAA).NumSamples != 2)) {
              if ((SUB84((pTexInfo->Flags).Info,4) >> 6 & 1) == 0) {
                if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                   ((pTexInfo->MSAA).NumSamples != 0x10)) {
                  if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                     ((pTexInfo->MSAA).NumSamples != 8)) {
                    if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                       ((pTexInfo->MSAA).NumSamples != 4)) {
                      if ((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0) ||
                         ((pTexInfo->MSAA).NumSamples != 2)) {
                        local_74 = 0;
                        if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
                          local_74 = 4;
                        }
                      }
                      else {
                        local_74 = 5;
                      }
                      local_70 = local_74;
                    }
                    else {
                      local_70 = 8;
                    }
                    local_6c = local_70;
                  }
                  else {
                    local_6c = 10;
                  }
                  local_68 = local_6c;
                }
                else {
                  local_68 = 0xb;
                }
                local_64 = local_68;
              }
              else {
                local_64 = 0;
              }
              local_60 = local_64;
            }
            else {
              local_60 = 1;
            }
            local_5c = local_60;
          }
          else {
            local_5c = 2;
          }
          local_58 = local_5c;
        }
        else {
          local_58 = 3;
        }
        local_54 = local_58;
      }
      else {
        local_54 = 4;
      }
      uVar2 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + local_54;
      *OffsetX = Gen10MipTailSlotOffset2DSurface[uVar2][local_3c].X * pTexInfo->BitsPerPixel >> 3;
      *OffsetY = Gen10MipTailSlotOffset2DSurface[uVar2][local_3c].Y;
      *OffsetZ = Gen10MipTailSlotOffset2DSurface[uVar2][local_3c].Z;
    }
  }
  return;
}

Assistant:

void GmmLib::GmmGen10TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel,
                                                           uint32_t *        OffsetX,
                                                           uint32_t *        OffsetY,
                                                           uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    // 3D textures follow the Gen9 mip tail format
    if(!pGmmLibContext->GetSkuTable().FtrStandardMipTailFormat ||
       pTexInfo->Type == RESOURCE_3D)
    {
        return GmmGen9TextureCalc::GetMipTailGeometryOffset(pTexInfo, MipLevel, OffsetX, OffsetY, OffsetZ);
    }

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               // TileYs
               ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 8) ? 3 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 4) ? 2 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 2) ? 1 :
               (pTexInfo->Flags.Info.TiledYs) ? 0 :
               // TileYf
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 16) ? 11 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 8) ? 10 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 4) ? 8 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 2) ? 5 :
               (pTexInfo->Flags.Info.TiledYf) ? 4 : 0);
        // clang-format on

        *OffsetX = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}